

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O3

void __thiscall Mems::give_every_mirror_a_sample_slow(Mems *this)

{
  Point_d *pPVar1;
  void *__src;
  Point_d *pPVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __first;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __last;
  pointer pPVar6;
  void *__dest;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Point_d *pPVar11;
  ulong uVar12;
  ostream *poVar13;
  pointer pMVar14;
  pointer pMVar15;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> _Var16;
  void *pvVar17;
  long lVar18;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> __first_00;
  size_t __n;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __i;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> __last_00;
  Point_d *pPVar19;
  long lVar20;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"give every mirror a sample",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  __first_00._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last_00._M_current =
       (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first_00._M_current != __last_00._M_current) {
    uVar12 = ((long)__last_00._M_current - (long)__first_00._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
    lVar18 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first_00,__last_00,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b332);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first_00,__last_00,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b332);
    __first_00._M_current =
         (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last_00._M_current =
         (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  uVar12 = ((long)__last_00._M_current - (long)__first_00._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
  if ((ulong)((long)(this->_mems_mirrors_randomrasterized).
                    super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->_mems_mirrors_randomrasterized).
                   super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                   super__Vector_impl_data._M_start) <
      (ulong)((long)__last_00._M_current - (long)__first_00._M_current)) {
    do {
      if (__first_00._M_current != __last_00._M_current) {
        lVar18 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
                  (__first_00,__last_00,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b36e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
                  (__first_00,__last_00,
                   (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b36e);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mirror with smallest ammount of samples has  ",0x2d);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," samples. ",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      pMVar14 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pMVar14 !=
          (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          __first._M_current =
               (pMVar14->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               (pMVar14->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__first._M_current != __last._M_current) {
            uVar12 = (long)__last._M_current - (long)__first._M_current >> 5;
            lVar18 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Point_d_const&,Point_d_const&)>>
                      (__first,__last,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<bool_(*)(const_Point_d_&,_const_Point_d_&)>)0x10b37d);
            _Var16._M_current = __first._M_current;
            if ((long)__last._M_current - (long)__first._M_current < 0x201) {
              while (pPVar19 = _Var16._M_current + 1, pPVar19 != __last._M_current) {
                dVar3 = pPVar19->dis;
                if ((__first._M_current)->dis <= dVar3) {
                  dVar7 = pPVar19->x;
                  dVar8 = pPVar19->y;
                  iVar5 = pPVar19->id;
                  dVar4 = (_Var16._M_current)->dis;
                  pPVar2 = pPVar19;
                  while (dVar3 < dVar4) {
                    uVar9 = *(undefined8 *)((long)&pPVar2[-1].dis + 4);
                    *(undefined8 *)((long)&pPVar2->y + 4) = *(undefined8 *)((long)&pPVar2[-1].y + 4)
                    ;
                    *(undefined8 *)((long)&pPVar2->dis + 4) = uVar9;
                    dVar4 = pPVar2[-1].y;
                    pPVar2->x = pPVar2[-1].x;
                    pPVar2->y = dVar4;
                    dVar4 = pPVar2[-2].dis;
                    pPVar2 = pPVar2 + -1;
                  }
                  pPVar2->x = dVar7;
                  pPVar2->y = dVar8;
                  pPVar2->dis = dVar3;
                  pPVar2->id = iVar5;
                  _Var16._M_current = pPVar19;
                }
                else {
                  dVar3 = pPVar19->x;
                  dVar4 = pPVar19->y;
                  local_48 = SUB84(pPVar19->dis,0);
                  uStack_44 = (undefined4)((ulong)pPVar19->dis >> 0x20);
                  uStack_40 = (undefined4)*(undefined8 *)&pPVar19->id;
                  uStack_4c = (undefined4)((ulong)dVar4 >> 0x20);
                  memmove((void *)((long)_Var16._M_current +
                                  (0x40 - ((long)pPVar19 - (long)__first._M_current))),
                          __first._M_current,(long)pPVar19 - (long)__first._M_current);
                  (__first._M_current)->x = dVar3;
                  (__first._M_current)->y = dVar4;
                  *(ulong *)((long)&(__first._M_current)->y + 4) = CONCAT44(local_48,uStack_4c);
                  *(ulong *)((long)&(__first._M_current)->dis + 4) = CONCAT44(uStack_40,uStack_44);
                  _Var16._M_current = pPVar19;
                }
              }
            }
            else {
              __n = 0x20;
              pPVar19 = __first._M_current + 1;
              do {
                pPVar2 = (Point_d *)((long)&(__first._M_current)->x + __n);
                dVar3 = *(double *)((long)&(__first._M_current)->dis + __n);
                if ((__first._M_current)->dis <= dVar3) {
                  dVar7 = pPVar2->x;
                  dVar8 = pPVar2->y;
                  iVar5 = pPVar2->id;
                  dVar4 = (_Var16._M_current)->dis;
                  pPVar1 = pPVar2;
                  pPVar11 = pPVar19;
                  while (dVar3 < dVar4) {
                    pPVar1 = pPVar11 + -1;
                    uVar9 = *(undefined8 *)((long)&pPVar11[-1].dis + 4);
                    *(undefined8 *)((long)&pPVar11->y + 4) =
                         *(undefined8 *)((long)&pPVar11[-1].y + 4);
                    *(undefined8 *)((long)&pPVar11->dis + 4) = uVar9;
                    dVar4 = pPVar11[-1].y;
                    pPVar11->x = pPVar11[-1].x;
                    pPVar11->y = dVar4;
                    dVar4 = pPVar11[-2].dis;
                    pPVar11 = pPVar1;
                  }
                  pPVar1->x = dVar7;
                  pPVar1->y = dVar8;
                  pPVar1->dis = dVar3;
                  pPVar1->id = iVar5;
                }
                else {
                  dVar3 = pPVar2->x;
                  dVar4 = pPVar2->y;
                  local_48 = SUB84(pPVar2->dis,0);
                  uStack_44 = (undefined4)((ulong)pPVar2->dis >> 0x20);
                  uStack_40 = (undefined4)*(undefined8 *)&pPVar2->id;
                  uStack_4c = (undefined4)((ulong)dVar4 >> 0x20);
                  memmove(__first._M_current + 1,__first._M_current,__n);
                  (__first._M_current)->x = dVar3;
                  (__first._M_current)->y = dVar4;
                  *(ulong *)((long)&(__first._M_current)->y + 4) = CONCAT44(local_48,uStack_4c);
                  *(ulong *)((long)&(__first._M_current)->dis + 4) = CONCAT44(uStack_40,uStack_44);
                }
                __n = __n + 0x20;
                pPVar19 = pPVar19 + 1;
                _Var16._M_current = pPVar2;
              } while (__n != 0x200);
              for (pPVar19 = __first._M_current + 0x10; pPVar19 != __last._M_current;
                  pPVar19 = pPVar19 + 1) {
                dVar7 = pPVar19->x;
                dVar8 = pPVar19->y;
                dVar3 = pPVar19->dis;
                iVar5 = pPVar19->id;
                dVar4 = pPVar19[-1].dis;
                pPVar2 = pPVar19;
                while (dVar3 < dVar4) {
                  uVar9 = *(undefined8 *)((long)&pPVar2[-1].dis + 4);
                  *(undefined8 *)((long)&pPVar2->y + 4) = *(undefined8 *)((long)&pPVar2[-1].y + 4);
                  *(undefined8 *)((long)&pPVar2->dis + 4) = uVar9;
                  dVar4 = pPVar2[-1].y;
                  pPVar2->x = pPVar2[-1].x;
                  pPVar2->y = dVar4;
                  dVar4 = pPVar2[-2].dis;
                  pPVar2 = pPVar2 + -1;
                }
                pPVar2->x = dVar7;
                pPVar2->y = dVar8;
                pPVar2->dis = dVar3;
                pPVar2->id = iVar5;
              }
            }
          }
          pMVar14 = pMVar14 + 1;
        } while (pMVar14 !=
                 (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        pMVar14 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pPVar6 = (pMVar14->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar3 = pPVar6->y;
      uVar9 = *(undefined8 *)((long)&pPVar6->y + 4);
      uVar10 = *(undefined8 *)((long)&pPVar6->dis + 4);
      (pMVar14->_displayed_sample).x = pPVar6->x;
      (pMVar14->_displayed_sample).y = dVar3;
      *(undefined8 *)((long)&(pMVar14->_displayed_sample).y + 4) = uVar9;
      *(undefined8 *)((long)&(pMVar14->_displayed_sample).dis + 4) = uVar10;
      pMVar14 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar14->has_sample = true;
      pPVar6 = *(pointer *)
                &(pMVar14->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl;
      if (*(pointer *)
           ((long)&(pMVar14->_matching_samples).
                   super__Vector_base<Point_d,_std::allocator<Point_d>_> + 8) != pPVar6) {
        *(pointer *)
         ((long)&(pMVar14->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>
         + 8) = pPVar6;
        pMVar14 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar14->_ammount_of_matching_samples = 0xd9038;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"_mems_mirror.begin() on pos: x: ",0x20);
      poVar13 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_position).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," y: ",4);
      poVar13 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_position).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"_mems_mirror.begin() shows now: x: ",0x23);
      poVar13 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_displayed_sample).x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," y: ",4);
      poVar13 = std::ostream::_M_insert<double>
                          ((((this->_mems_mirrors).
                             super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                             super__Vector_impl_data._M_start)->_displayed_sample).y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      pMVar14 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar15 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pMVar15 != pMVar14) {
        lVar18 = 0x28;
        lVar20 = 0;
        do {
          if (*(char *)((long)&pMVar14->_ammount_of_matching_samples + lVar18) == '\0') {
            __dest = *(void **)((long)&pMVar14->id + lVar18);
            pvVar17 = *(void **)((long)&(pMVar14->_position).x + lVar18);
            if ((pvVar17 != __dest) &&
               ((pMVar14->_displayed_sample).id == *(int *)((long)__dest + 0x18))) {
              __src = (void *)((long)__dest + 0x20);
              if (__src != pvVar17) {
                memmove(__dest,__src,(long)pvVar17 - (long)__src);
                pvVar17 = *(void **)((long)&(pMVar14->_position).x + lVar18);
              }
              *(long *)((long)&(pMVar14->_position).x + lVar18) = (long)pvVar17 + -0x20;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"sample erased  ",0xf);
              pMVar14 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar15 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
          }
          lVar20 = lVar20 + 1;
          lVar18 = lVar18 + 0x88;
        } while (lVar20 != ((long)pMVar15 - (long)pMVar14 >> 3) * -0xf0f0f0f0f0f0f0f);
      }
      std::vector<Mirror,_std::allocator<Mirror>_>::push_back
                (&this->_mems_mirrors_randomrasterized,pMVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"new mirrorvector has size: ",0x1b);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      __first_00._M_current =
           (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
           super__Vector_impl_data._M_start;
      __last_00._M_current =
           (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar12 = ((long)__last_00._M_current - (long)__first_00._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
    } while ((ulong)((long)(this->_mems_mirrors_randomrasterized).
                           super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->_mems_mirrors_randomrasterized).
                          super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                          super__Vector_impl_data._M_start) <
             (ulong)((long)__last_00._M_current - (long)__first_00._M_current));
  }
  if (__first_00._M_current != __last_00._M_current) {
    lVar18 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first_00,__last_00,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b34e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Mirror*,std::vector<Mirror,std::allocator<Mirror>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Mirror_const&,Mirror_const&)>>
              (__first_00,__last_00,
               (_Iter_comp_iter<bool_(*)(const_Mirror_&,_const_Mirror_&)>)0x10b34e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"give every mirror a sample ends now. ",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void Mems::give_every_mirror_a_sample_slow(){
      std::cout<<"\n";

      std::cout<<"give every mirror a sample"<< "\n"<< "\n";
      std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount_of_matching_samples);

      while(_mems_mirrors_randomrasterized.size() < _mems_mirrors.size())
      {
  //      std::cout<<"Pixels left: "<<_mems_mirrors.size()<<"\n";
        //sorting mems for sample availability
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_ammount);

        std::cout << "Mirror with smallest ammount of samples has  " <<_mems_mirrors.begin()->_matching_samples.size()<<" samples. " <<"\n";
        //gehe durch alle spiegel und sortiere ihren sample vector der größe nach
        for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
        {
          std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
        }

        // give first mirror(am wenigsten matches) sample_displayed which is at matching samples first position
        _mems_mirrors.begin()->_displayed_sample = _mems_mirrors.begin()->_matching_samples.front();
        _mems_mirrors.begin()->has_sample = true;
        _mems_mirrors.begin()->_matching_samples.clear();
        _mems_mirrors.begin()->_ammount_of_matching_samples = 888888;
        std::cout<<"_mems_mirror.begin() on pos: x: "<<_mems_mirrors.begin()->_position.x<<" y: "<<_mems_mirrors.begin()->_position.y<<"\n";
        std::cout<<"_mems_mirror.begin() shows now: x: "<<_mems_mirrors.begin()->_displayed_sample.x<<" y: "<<_mems_mirrors.begin()->_displayed_sample.y<<"\n";

        //point aus allen umliegenden mirrors als available point löschen

        for(int it = 0; it != _mems_mirrors.size(); ++it){
          //std::cout<<"mi erased0  ";
          if(_mems_mirrors[it].has_sample == false){

            for(int mi = 0; mi != _mems_mirrors[it]._matching_samples.size(); ++mi){

              if(_mems_mirrors.begin()->_displayed_sample.id == _mems_mirrors[it]._matching_samples[mi].id){
              /*  std::cout<< "matching samples size before erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id of sample "<<"\n";
                }
                */
                _mems_mirrors[it]._matching_samples.erase(_mems_mirrors[it]._matching_samples.begin()+ mi);
              //  it->_ammount_of_matching_samples = it->_matching_samples.size();
                std::cout<<"sample erased  ";

              /*  std::cout<< "matching samples size after erase: "<< _mems_mirrors[it]._matching_samples.size()<<"\n";
                for( auto debug = std::begin(_mems_mirrors[it]._matching_samples); debug != std::end(_mems_mirrors[it]._matching_samples); ++debug){
                  std::cout<<debug->id<<" is id "<<"\n";
                }
                */
              }
              break;
            }
          }
        }
        _mems_mirrors_randomrasterized.push_back(*_mems_mirrors.begin());
        std::cout<<"new mirrorvector has size: "<<_mems_mirrors_randomrasterized.size()<<"\n"<<"\n"<<"\n"<<"\n";

        }
        std::sort(_mems_mirrors.begin(), _mems_mirrors.end(), compare_by_idi);
        std::cout<<"give every mirror a sample ends now. "<<"\n";


      }